

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash.c
# Opt level: O0

ion_status_t oah_get(ion_hashmap_t *hash_map,ion_key_t key,ion_value_t value)

{
  ion_status_t iVar1;
  ion_err_t iVar2;
  ion_hash_bucket_t *item;
  int data_length;
  int loc;
  ion_value_t value_local;
  ion_key_t key_local;
  ion_hashmap_t *hash_map_local;
  
  _data_length = value;
  value_local = key;
  key_local = hash_map;
  iVar2 = oah_find_item_loc(hash_map,key,(int *)((long)&item + 4));
  if (iVar2 != '\0') {
    hash_map_local._0_4_ = CONCAT31(hash_map_local._1_3_,1);
  }
  else {
    item._0_4_ = *(int *)((long)key_local + 4) + *(int *)((long)key_local + 8);
    memcpy(_data_length,
           (void *)(*(long *)((long)key_local + 0x30) + (long)(((int)item + 1) * item._4_4_) + 1 +
                   (long)*(int *)((long)key_local + 4)),(long)*(int *)((long)key_local + 8));
    hash_map_local._0_4_ = (uint)hash_map_local & 0xffffff00;
  }
  iVar1.count._0_1_ = iVar2 == '\0';
  iVar1._0_4_ = (uint)hash_map_local;
  iVar1.count._1_3_ = 0;
  return iVar1;
}

Assistant:

ion_status_t
oah_get(
	ion_hashmap_t	*hash_map,
	ion_key_t		key,
	ion_value_t		value
) {
	int loc;

	if (oah_find_item_loc(hash_map, key, &loc) == err_ok) {
#if ION_DEBUG
		printf("Item found at location %d\n", loc);
#endif

		int					data_length = hash_map->super.record.key_size + hash_map->super.record.value_size;
		ion_hash_bucket_t	*item		= (((ion_hash_bucket_t *) ((hash_map->entry + (data_length + SIZEOF(STATUS)) * loc))));

		/* *value				   = malloc(sizeof(char) * (hash_map->super.record.value_size)); */
		memcpy(value, (item->data + hash_map->super.record.key_size), hash_map->super.record.value_size);
		return ION_STATUS_OK(1);
	}
	else {
#if ION_DEBUG
		printf("Item not found in hash table.\n");
#endif
		return ION_STATUS_ERROR(err_item_not_found);
	}
}